

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

ProStringList * __thiscall
QMakeEvaluator::split_value_list
          (ProStringList *__return_storage_ptr__,QMakeEvaluator *this,QStringView vals,int source)

{
  int iVar1;
  storage_type_conflict sVar2;
  long lVar3;
  ProFile *pPVar4;
  bool bVar5;
  Data *pDVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  QChar QVar10;
  storage_type_conflict sVar11;
  int iVar12;
  long in_FS_OFFSET;
  int local_9c;
  ProString local_88;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  local_9c = source;
  if (source == 0) {
    lVar3 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
    if (lVar3 == 0) {
      local_9c = 0;
    }
    else {
      pPVar4 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar3 + -1];
      local_9c = 0;
      if (pPVar4 != (ProFile *)0x0) {
        local_9c = pPVar4->m_id;
      }
    }
  }
  iVar12 = (int)vals.m_size;
  if (0 < iVar12) {
    iVar9 = 0;
    bVar5 = false;
    sVar11 = L'\0';
    do {
      sVar2 = vals.m_data[iVar9];
      QVar10.ucs = (char16_t)&local_58;
      if (sVar2 == sVar11) {
        QString::append(QVar10);
        bVar5 = true;
LAB_0027cdee:
        sVar11 = L'\0';
      }
      else {
        bVar7 = true;
        if ((ushort)sVar2 < 0x22) {
          if (((sVar2 != L'\t') && (sVar2 != L' ')) || (bVar7 = bVar5, sVar11 != L'\0'))
          goto LAB_0027cf39;
          if (!bVar5) goto LAB_0027cdee;
          ProString::ProString(&local_88,&local_58);
          local_88.m_file = local_9c;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                    ((QMovableArrayOps<ProString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->super_QList<ProString>).d.size,&local_88);
          QList<ProString>::end(&__return_storage_ptr__->super_QList<ProString>);
          if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          pDVar6 = local_58.d.d;
          if (local_58.d.ptr != (char16_t *)0x0) {
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (char16_t *)0x0;
            local_58.d.size = 0;
            if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
              }
            }
          }
          sVar11 = L'\0';
          bVar5 = false;
        }
        else {
          if (sVar2 == L'\"') {
LAB_0027ce13:
            if (sVar11 == L'\0') {
              sVar11 = sVar2;
            }
          }
          else if (sVar2 == L'\\') {
            iVar1 = iVar9 + 1;
            if (((iVar1 != iVar12) && (uVar8 = (ushort)vals.m_data[iVar1] - 0x22, uVar8 < 0x3b)) &&
               ((0x400000000000021U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
              QString::append(QVar10);
              iVar9 = iVar1;
            }
          }
          else if (sVar2 == L'\'') goto LAB_0027ce13;
LAB_0027cf39:
          bVar5 = bVar7;
          QString::append((QChar)(char16_t)&local_58);
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar12);
    if (bVar5) {
      ProString::ProString(&local_88,&local_58);
      local_88.m_file = local_9c;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super_QList<ProString>).d.size,&local_88);
      QList<ProString>::end(&__return_storage_ptr__->super_QList<ProString>);
      if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ProStringList QMakeEvaluator::split_value_list(QStringView vals, int source)
{
    QString build;
    ProStringList ret;

    if (!source)
        source = currentFileId();

    const QChar *vals_data = vals.data();
    const int vals_len = vals.size();
    char16_t quote = 0;
    bool hadWord = false;
    for (int x = 0; x < vals_len; x++) {
        char16_t unicode = vals_data[x].unicode();
        if (unicode == quote) {
            quote = 0;
            hadWord = true;
            build += QChar(unicode);
            continue;
        }
        switch (unicode) {
        case '"':
        case '\'':
            if (!quote)
                quote = unicode;
            // FIXME: this is inconsistent with the "there are no empty strings" dogma.
            hadWord = true;
            break;
        case ' ':
        case '\t':
            if (!quote) {
                if (hadWord) {
                    ret << ProString(build).setSource(source);
                    build.clear();
                    hadWord = false;
                }
                continue;
            }
            break;
        case '\\':
            if (x + 1 != vals_len) {
                char16_t next = vals_data[++x].unicode();
                if (next == '\'' || next == '"' || next == '\\') {
                    build += QChar(unicode);
                    unicode = next;
                } else {
                    --x;
                }
            }
            Q_FALLTHROUGH();
        default:
            hadWord = true;
            break;
        }
        build += QChar(unicode);
    }
    if (hadWord)
        ret << ProString(build).setSource(source);
    return ret;
}